

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

iterator __thiscall llvm::yaml::Scanner::skip_b_break(Scanner *this,iterator Position)

{
  iterator pcVar1;
  
  pcVar1 = Position;
  if (this->End != Position) {
    if (*Position == '\n') {
      pcVar1 = Position + 1;
    }
    else if (((*Position == '\r') && (pcVar1 = Position + 1, pcVar1 != this->End)) &&
            (Position[1] == '\n')) {
      pcVar1 = Position + 2;
    }
  }
  return pcVar1;
}

Assistant:

StringRef::iterator Scanner::skip_b_break(StringRef::iterator Position) {
  if (Position == End)
    return Position;
  if (*Position == 0x0D) {
    if (Position + 1 != End && *(Position + 1) == 0x0A)
      return Position + 2;
    return Position + 1;
  }

  if (*Position == 0x0A)
    return Position + 1;
  return Position;
}